

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O3

bool __thiscall
dtc::input_buffer::consume_char_literal(input_buffer *this,unsigned_long_long *outInt)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  unsigned_long_long uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  iVar2 = this->size;
  uVar3 = this->cursor;
  if ((int)uVar3 < 0 || iVar2 <= (int)uVar3) {
    *outInt = 0;
    this->cursor = uVar3 + 1;
    return true;
  }
  pcVar4 = this->buffer;
  uVar8 = (ulong)(byte)pcVar4[uVar3];
  lVar7 = (ulong)uVar3 + 1;
  *outInt = uVar8;
  iVar6 = (int)lVar7;
  this->cursor = iVar6;
  if (uVar8 != 0x5c) {
    return true;
  }
  if (iVar2 <= iVar6) {
    return false;
  }
  bVar1 = pcVar4[lVar7];
  *outInt = (ulong)bVar1;
  this->cursor = uVar3 + 2;
  if (bVar1 < 0x6e) {
    if (bVar1 == 0x27) {
      return true;
    }
    if (bVar1 != 0x30) {
      if (bVar1 == 0x5c) {
        return true;
      }
      return false;
    }
    uVar5 = 0;
  }
  else if (bVar1 == 0x6e) {
    uVar5 = 10;
  }
  else if (bVar1 == 0x74) {
    uVar5 = 9;
  }
  else {
    if (bVar1 != 0x72) {
      return false;
    }
    uVar5 = 0xd;
  }
  *outInt = uVar5;
  return true;
}

Assistant:

inline char operator[](int offset)
	{
		if (cursor + offset >= size) { return '\0'; }
		if (cursor + offset < 0) { return '\0'; }
		return buffer[cursor + offset];
	}